

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall embree::SceneGraph::GroupNode::resetInDegree(GroupNode *this)

{
  size_t *psVar1;
  pointer pRVar2;
  Ref<embree::SceneGraph::Node> *c;
  pointer pRVar3;
  
  (this->super_Node).closed = false;
  if ((this->super_Node).indegree == 1) {
    pRVar2 = (this->children).
             super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pRVar3 = (this->children).
                  super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pRVar3 != pRVar2; pRVar3 = pRVar3 + 1)
    {
      (*(pRVar3->ptr->super_RefCount)._vptr_RefCount[8])();
    }
  }
  psVar1 = &(this->super_Node).indegree;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

void SceneGraph::GroupNode::resetInDegree()
  {
    closed = false;
    if (indegree == 1) {
      for (auto&  c : children)
        c->resetInDegree();
    }
    indegree--;
  }